

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

_Bool hex_encode(void *buf,size_t bufsize,char *dest,size_t destsize)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uStack_38;
  uint c;
  size_t i;
  size_t destsize_local;
  char *dest_local;
  size_t bufsize_local;
  void *buf_local;
  
  sVar3 = hex_str_size(bufsize);
  if (destsize < sVar3) {
    buf_local._7_1_ = false;
  }
  else {
    destsize_local = (size_t)dest;
    for (uStack_38 = 0; uStack_38 < bufsize; uStack_38 = uStack_38 + 1) {
      bVar1 = *(byte *)((long)buf + uStack_38);
      cVar2 = hexchar((uint)(bVar1 >> 4));
      pcVar4 = (char *)(destsize_local + 1);
      *(char *)destsize_local = cVar2;
      cVar2 = hexchar(bVar1 & 0xf);
      destsize_local = destsize_local + 2;
      *pcVar4 = cVar2;
    }
    *(undefined1 *)destsize_local = 0;
    buf_local._7_1_ = true;
  }
  return buf_local._7_1_;
}

Assistant:

bool hex_encode(const void *buf, size_t bufsize, char *dest, size_t destsize)
{
	size_t i;

	if (destsize < hex_str_size(bufsize))
		return false;

	for (i = 0; i < bufsize; i++) {
		unsigned int c = ((const unsigned char *)buf)[i];
		*(dest++) = hexchar(c >> 4);
		*(dest++) = hexchar(c & 0xF);
	}
	*dest = '\0';

	return true;
}